

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int walIndexReadHdr(Wal *pWal,int *pChanged)

{
  u32 *puVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  u8 *aFrame;
  long lVar6;
  uint uVar7;
  uint uVar8;
  int n;
  u32 uVar9;
  uint uVar10;
  u32 local_90;
  u32 pgno;
  u8 aBuf [32];
  u32 *page0;
  i64 nSize;
  undefined8 local_58;
  undefined8 uStack_50;
  u8 *local_40;
  long local_38;
  
  iVar4 = walIndexPage(pWal,0,&page0);
  if (iVar4 != 0) {
    if (iVar4 != 0x508) {
      return iVar4;
    }
    pWal->bShmUnreliable = '\x01';
    pWal->exclusiveMode = '\x02';
    *pChanged = 1;
  }
  if ((page0 == (u32 *)0x0) || (iVar5 = walIndexTryHdr(pWal,pChanged), iVar5 != 0)) {
    if ((pWal->bShmUnreliable != '\0') || ((pWal->readOnly & 2) == 0)) {
      uVar9 = 1;
      iVar4 = walLockExclusive(pWal,0,1);
      if (iVar4 == 0) {
        pWal->writeLock = '\x01';
        iVar4 = 0;
        iVar5 = walIndexPage(pWal,0,&page0);
        if (iVar5 == 0) {
          iVar5 = walIndexTryHdr(pWal,pChanged);
          if (iVar5 == 0) {
            bVar2 = true;
          }
          else {
            n = 2 - (uint)pWal->ckptLock;
            iVar5 = pWal->ckptLock + 1;
            iVar4 = walLockExclusive(pWal,iVar5,n);
            if (iVar4 == 0) {
              iVar4 = walLockExclusive(pWal,4,4);
              if (iVar4 == 0) {
                (pWal->hdr).aSalt[0] = 0;
                (pWal->hdr).aSalt[1] = 0;
                (pWal->hdr).aCksum[0] = 0;
                (pWal->hdr).aCksum[1] = 0;
                (pWal->hdr).mxFrame = 0;
                (pWal->hdr).nPage = 0;
                (pWal->hdr).aFrameCksum[0] = 0;
                (pWal->hdr).aFrameCksum[1] = 0;
                local_58 = 0;
                uStack_50 = 0;
                (pWal->hdr).iVersion = 0;
                (pWal->hdr).unused = 0;
                (pWal->hdr).iChange = 0;
                (pWal->hdr).isInit = '\0';
                (pWal->hdr).bigEndCksum = '\0';
                (pWal->hdr).szPage = 0;
                iVar4 = (*pWal->pWalFd->pMethods->xFileSize)(pWal->pWalFd,&nSize);
                if (iVar4 == 0) {
                  if (0x20 < nSize) {
                    iVar4 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,aBuf,0x20,0);
                    if (iVar4 != 0) goto LAB_00131fbc;
                    if ((aBuf[3] & 0xfffffffe |
                        ((uint)aBuf._0_4_ >> 0x10 & 0xff) << 8 |
                        ((uint)aBuf._0_4_ >> 8 & 0xff) << 0x10 | aBuf._0_4_ << 0x18) == 0x377f0682)
                    {
                      uVar7 = ((uint)aBuf._8_4_ >> 8 & 0xff) << 0x10 | aBuf._8_4_ << 0x18;
                      uVar10 = ((uint)aBuf._8_4_ >> 0x10 & 0xff) << 8;
                      uVar8 = (uint)aBuf._8_4_ >> 0x18 | uVar7 | uVar10;
                      if (0xffff01fe < uVar8 - 0x10001 && (uVar8 & uVar8 - 1) == 0) {
                        (pWal->hdr).bigEndCksum = (u8)(aBuf[3] & 1);
                        pWal->szPage = uVar8;
                        pWal->nCkpt = (uint)aBuf._12_4_ >> 0x18 | (aBuf._12_4_ & 0xff0000) >> 8 |
                                      (aBuf._12_4_ & 0xff00) << 8 | aBuf._12_4_ << 0x18;
                        *(undefined8 *)(pWal->hdr).aSalt = aBuf._16_8_;
                        walChecksumBytes(aBuf[3] & 1 ^ 1,aBuf,0x18,(u32 *)0x0,
                                         (pWal->hdr).aFrameCksum);
                        if (((pWal->hdr).aFrameCksum[0] ==
                             ((uint)aBuf._24_4_ >> 0x18 | (aBuf._24_4_ & 0xff0000) >> 8 |
                              (aBuf._24_4_ & 0xff00) << 8 | aBuf._24_4_ << 0x18)) &&
                           ((pWal->hdr).aFrameCksum[1] ==
                            ((uint)aBuf._28_4_ >> 0x18 | (aBuf._28_4_ & 0xff0000) >> 8 |
                             (aBuf._28_4_ & 0xff00) << 8 | aBuf._28_4_ << 0x18))) {
                          if (((uint)aBuf._4_4_ >> 0x18 | (aBuf._4_4_ & 0xff0000) >> 8 |
                               (aBuf._4_4_ & 0xff00) << 8 | aBuf._4_4_ << 0x18) == 0x2de218) {
                            uVar8 = uVar8 + 0x18;
                            aFrame = (u8 *)sqlite3_malloc64((ulong)uVar8);
                            if (aFrame == (u8 *)0x0) {
                              iVar4 = 7;
                            }
                            else {
                              local_40 = aFrame + 0x18;
                              local_58 = 0;
                              uStack_50 = 0;
                              local_38 = 0x20;
                              while (lVar6 = (ulong)uVar8 + local_38, lVar6 <= nSize) {
                                lVar3 = local_38;
                                local_38 = lVar6;
                                iVar4 = (*pWal->pWalFd->pMethods->xRead)
                                                  (pWal->pWalFd,aFrame,uVar8,lVar3);
                                if (iVar4 != 0) goto LAB_00131f3c;
                                iVar4 = walDecodeFrame(pWal,&pgno,&local_90,local_40,aFrame);
                                lVar6 = local_38;
                                if (iVar4 == 0) break;
                                iVar4 = walIndexAppend(pWal,uVar9,pgno);
                                if (iVar4 != 0) goto LAB_00131f3c;
                                if (local_90 != 0) {
                                  (pWal->hdr).mxFrame = uVar9;
                                  (pWal->hdr).nPage = local_90;
                                  (pWal->hdr).szPage = (ushort)(uVar7 >> 0x10) | (ushort)uVar10;
                                  local_58 = *(undefined8 *)(pWal->hdr).aFrameCksum;
                                  uStack_50 = 0;
                                }
                                uVar9 = uVar9 + 1;
                              }
                              local_38 = lVar6;
                              iVar4 = 0;
LAB_00131f3c:
                              sqlite3_free(aFrame);
                              if (iVar4 == 0) goto LAB_00131f4b;
                            }
                          }
                          else {
                            iVar4 = sqlite3CantopenError(0xe893);
                          }
                          goto LAB_00131fbc;
                        }
                      }
                    }
                  }
LAB_00131f4b:
                  *(undefined8 *)(pWal->hdr).aFrameCksum = local_58;
                  walIndexWriteHdr(pWal);
                  puVar1 = *pWal->apWiData;
                  puVar1[0x18] = 0;
                  puVar1[0x20] = (pWal->hdr).mxFrame;
                  puVar1[0x19] = 0;
                  for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
                    puVar1[lVar6 + 0x1a] = 0xffffffff;
                  }
                  uVar9 = (pWal->hdr).mxFrame;
                  if (uVar9 != 0) {
                    puVar1[0x1a] = uVar9;
                  }
                  if ((pWal->hdr).nPage == 0) {
                    iVar4 = 0;
                  }
                  else {
                    iVar4 = 0;
                    sqlite3_log(0x11b,"recovered %d frames from WAL file %s",
                                (ulong)(pWal->hdr).mxFrame,pWal->zWalName);
                  }
                }
LAB_00131fbc:
                walUnlockExclusive(pWal,iVar5,n);
                n = 4;
                iVar5 = n;
              }
              walUnlockExclusive(pWal,iVar5,n);
            }
            *pChanged = 1;
            bVar2 = false;
          }
        }
        else {
          bVar2 = false;
          iVar4 = iVar5;
        }
        pWal->writeLock = '\0';
        walUnlockExclusive(pWal,0,1);
        if (bVar2) goto LAB_00131ff5;
      }
      goto LAB_0013200b;
    }
    iVar4 = walLockShared(pWal,0);
    if (iVar4 != 0) goto LAB_0013200b;
    walUnlockShared(pWal,0);
    iVar4 = 0x108;
    if (pWal->bShmUnreliable == '\0') {
      return 0x108;
    }
  }
  else {
LAB_00131ff5:
    if ((pWal->hdr).iVersion != 0x2de218) {
      iVar4 = sqlite3CantopenError(0xec65);
    }
LAB_0013200b:
    if (pWal->bShmUnreliable == '\0') {
      return iVar4;
    }
    if (iVar4 == 0) {
      iVar5 = 0;
      goto LAB_00132036;
    }
  }
  walIndexClose(pWal,0);
  pWal->bShmUnreliable = '\0';
  iVar5 = -1;
  if (iVar4 != 0x20a) {
    iVar5 = iVar4;
  }
LAB_00132036:
  pWal->exclusiveMode = '\0';
  return iVar5;
}

Assistant:

static int walIndexReadHdr(Wal *pWal, int *pChanged){
  int rc;                         /* Return code */
  int badHdr;                     /* True if a header read failed */
  volatile u32 *page0;            /* Chunk of wal-index containing header */

  /* Ensure that page 0 of the wal-index (the page that contains the 
  ** wal-index header) is mapped. Return early if an error occurs here.
  */
  assert( pChanged );
  rc = walIndexPage(pWal, 0, &page0);
  if( rc!=SQLITE_OK ){
    assert( rc!=SQLITE_READONLY ); /* READONLY changed to OK in walIndexPage */
    if( rc==SQLITE_READONLY_CANTINIT ){
      /* The SQLITE_READONLY_CANTINIT return means that the shared-memory
      ** was openable but is not writable, and this thread is unable to
      ** confirm that another write-capable connection has the shared-memory
      ** open, and hence the content of the shared-memory is unreliable,
      ** since the shared-memory might be inconsistent with the WAL file
      ** and there is no writer on hand to fix it. */
      assert( page0==0 );
      assert( pWal->writeLock==0 );
      assert( pWal->readOnly & WAL_SHM_RDONLY );
      pWal->bShmUnreliable = 1;
      pWal->exclusiveMode = WAL_HEAPMEMORY_MODE;
      *pChanged = 1;
    }else{
      return rc; /* Any other non-OK return is just an error */
    }
  }else{
    /* page0 can be NULL if the SHM is zero bytes in size and pWal->writeLock
    ** is zero, which prevents the SHM from growing */
    testcase( page0!=0 );
  }
  assert( page0!=0 || pWal->writeLock==0 );

  /* If the first page of the wal-index has been mapped, try to read the
  ** wal-index header immediately, without holding any lock. This usually
  ** works, but may fail if the wal-index header is corrupt or currently 
  ** being modified by another thread or process.
  */
  badHdr = (page0 ? walIndexTryHdr(pWal, pChanged) : 1);

  /* If the first attempt failed, it might have been due to a race
  ** with a writer.  So get a WRITE lock and try again.
  */
  assert( badHdr==0 || pWal->writeLock==0 );
  if( badHdr ){
    if( pWal->bShmUnreliable==0 && (pWal->readOnly & WAL_SHM_RDONLY) ){
      if( SQLITE_OK==(rc = walLockShared(pWal, WAL_WRITE_LOCK)) ){
        walUnlockShared(pWal, WAL_WRITE_LOCK);
        rc = SQLITE_READONLY_RECOVERY;
      }
    }else if( SQLITE_OK==(rc = walLockExclusive(pWal, WAL_WRITE_LOCK, 1)) ){
      pWal->writeLock = 1;
      if( SQLITE_OK==(rc = walIndexPage(pWal, 0, &page0)) ){
        badHdr = walIndexTryHdr(pWal, pChanged);
        if( badHdr ){
          /* If the wal-index header is still malformed even while holding
          ** a WRITE lock, it can only mean that the header is corrupted and
          ** needs to be reconstructed.  So run recovery to do exactly that.
          */
          rc = walIndexRecover(pWal);
          *pChanged = 1;
        }
      }
      pWal->writeLock = 0;
      walUnlockExclusive(pWal, WAL_WRITE_LOCK, 1);
    }
  }

  /* If the header is read successfully, check the version number to make
  ** sure the wal-index was not constructed with some future format that
  ** this version of SQLite cannot understand.
  */
  if( badHdr==0 && pWal->hdr.iVersion!=WALINDEX_MAX_VERSION ){
    rc = SQLITE_CANTOPEN_BKPT;
  }
  if( pWal->bShmUnreliable ){
    if( rc!=SQLITE_OK ){
      walIndexClose(pWal, 0);
      pWal->bShmUnreliable = 0;
      assert( pWal->nWiData>0 && pWal->apWiData[0]==0 );
      /* walIndexRecover() might have returned SHORT_READ if a concurrent
      ** writer truncated the WAL out from under it.  If that happens, it
      ** indicates that a writer has fixed the SHM file for us, so retry */
      if( rc==SQLITE_IOERR_SHORT_READ ) rc = WAL_RETRY;
    }
    pWal->exclusiveMode = WAL_NORMAL_MODE;
  }

  return rc;
}